

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *aabb,char *label,ImGuiDataType data_type,void *data_ptr,ImGuiID id,
               int decimal_precision)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  char buf [32];
  char local_58 [32];
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  pIVar3->ActiveId = pIVar3->ScalarAsInputTextId;
  pIVar3->ActiveIdIsJustActivated = true;
  pIVar3->ActiveIdAllowOverlap = false;
  pIVar3->ActiveIdWindow = pIVar2;
  pIVar3->HoveredId = 0;
  pIVar3->HoveredIdAllowOverlap = false;
  pIVar2->FocusIdxAllCounter = pIVar2->FocusIdxAllCounter + -1;
  pIVar2->FocusIdxTabCounter = pIVar2->FocusIdxTabCounter + -1;
  if (data_type == ImGuiDataType_Float) {
    if (decimal_precision < 0) {
      ImFormatString(local_58,0x20,"%f",(double)*data_ptr);
    }
    else {
      ImFormatString(local_58,0x20,"%.*f",(double)*data_ptr,decimal_precision);
    }
  }
  else if (data_type == ImGuiDataType_Int) {
    if (decimal_precision < 0) {
      ImFormatString(local_58,0x20,"%d",(ulong)*data_ptr);
    }
    else {
      ImFormatString(local_58,0x20,"%.*d",decimal_precision);
    }
  }
  local_38.x = (aabb->Max).x - (aabb->Min).x;
  local_38.y = (aabb->Max).y - (aabb->Min).y;
  bVar4 = InputTextEx(label,local_58,0x20,&local_38,0x11,(ImGuiTextEditCallback)0x0,(void *)0x0);
  IVar1 = pIVar3->ActiveId;
  if (pIVar3->ScalarAsInputTextId == 0) {
    if (IVar1 != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x18b8,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, const char *, ImGuiDataType, void *, ImGuiID, int)"
                   );
    }
    pIVar3->ScalarAsInputTextId = IVar1;
    pIVar3 = GImGui;
    GImGui->HoveredId = id;
    pIVar3->HoveredIdAllowOverlap = false;
  }
  else if (IVar1 != pIVar3->ScalarAsInputTextId) {
    pIVar3->ScalarAsInputTextId = 0;
  }
  if (bVar4) {
    bVar4 = DataTypeApplyOpFromText
                      (local_58,(GImGui->InputTextState).InitialText.Data,data_type,data_ptr,
                       (char *)0x0);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& aabb, const char* label, ImGuiDataType data_type, void* data_ptr, ImGuiID id, int decimal_precision)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    SetActiveID(g.ScalarAsInputTextId, window);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char buf[32];
    DataTypeFormatString(data_type, data_ptr, decimal_precision, buf, IM_ARRAYSIZE(buf));
    bool text_value_changed = InputTextEx(label, buf, IM_ARRAYSIZE(buf), aabb.GetSize(), ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_AutoSelectAll);
    if (g.ScalarAsInputTextId == 0)
    {
        // First frame
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID (else we'd need to store them both, which is also possible)
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    else if (g.ActiveId != g.ScalarAsInputTextId)
    {
        // Release
        g.ScalarAsInputTextId = 0;
    }
    if (text_value_changed)
        return DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}